

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O1

vec2f __thiscall Triangle::uv(Triangle *this,point *p)

{
  vec2f vVar1;
  vec2f vVar2;
  vec2f vVar3;
  float fVar4;
  vec2f vVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar15 = (this->v1).x;
  fVar4 = (this->v1).y;
  fVar6 = p->x - fVar15;
  fVar10 = p->y - fVar4;
  fVar14 = (this->v1).z;
  fVar8 = p->z - fVar14;
  fVar15 = (this->v2).x - fVar15;
  fVar4 = (this->v2).y - fVar4;
  fVar14 = (this->v2).z - fVar14;
  fVar11 = fVar10 * fVar14 - fVar4 * fVar8;
  fVar14 = fVar8 * fVar15 - fVar14 * fVar6;
  fVar15 = fVar4 * fVar6 - fVar15 * fVar10;
  fVar15 = fVar15 * fVar15 + fVar11 * fVar11 + fVar14 * fVar14;
  vVar1 = this->vt3;
  vVar2 = this->vt1;
  if (fVar15 < 0.0) {
    fVar15 = sqrtf(fVar15);
  }
  else {
    fVar15 = SQRT(fVar15);
  }
  fVar4 = this->one_by_2S;
  fVar10 = (this->vt1).x;
  fVar11 = (this->vt1).y;
  vVar3 = this->vt2;
  fVar14 = (this->v1).x;
  fVar6 = (this->v1).y;
  fVar7 = p->x - fVar14;
  fVar12 = p->y - fVar6;
  fVar8 = (this->v1).z;
  fVar9 = p->z - fVar8;
  fVar14 = (this->v3).x - fVar14;
  fVar6 = (this->v3).y - fVar6;
  fVar8 = (this->v3).z - fVar8;
  fVar13 = fVar12 * fVar8 - fVar6 * fVar9;
  fVar8 = fVar9 * fVar14 - fVar8 * fVar7;
  fVar14 = fVar6 * fVar7 - fVar14 * fVar12;
  fVar14 = fVar14 * fVar14 + fVar13 * fVar13 + fVar8 * fVar8;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    fVar14 = SQRT(fVar14);
  }
  vVar5.y = fVar4 * (vVar1.y - vVar2.y) * fVar15 + fVar11 +
            this->one_by_2S * (vVar3.y - fVar11) * fVar14;
  vVar5.x = fVar4 * (vVar1.x - vVar2.x) * fVar15 + fVar10 +
            this->one_by_2S * (vVar3.x - fVar10) * fVar14;
  return vVar5;
}

Assistant:

vec2f uv(const point& p) const
	{
		assert(onsurface(p));
		return
			vt1 + (vt3-vt1) * norm(cross(p-v1, v2-v1)) * one_by_2S
				+ (vt2-vt1) * norm(cross(p-v1, v3-v1)) * one_by_2S; // TO OPTIMIZE
	}